

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaCorot_20::ComputeKRMmatricesGlobal(ChElementHexaCorot_20 *this)

{
  ChMatrixRef *in_RSI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  
  ComputeKRMmatricesGlobal
            ((ChElementHexaCorot_20 *)&this[-1].Volume,in_RSI,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
  return;
}

Assistant:

void ChElementHexaCorot_20::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == GetNdofs()) && (H.cols() == GetNdofs()));

    // warp the local stiffness matrix K in order to obtain global
    // tangent stiffness CKCt:
    ChMatrixDynamic<> CK(GetNdofs(), GetNdofs());
    ChMatrixDynamic<> CKCt(GetNdofs(), GetNdofs());  // the global, corotated, K matrix, for 20 nodes
    ChMatrixCorotation::ComputeCK(StiffnessMatrix, this->A, 20, CK);
    ChMatrixCorotation::ComputeKCt(CK, this->A, 20, CKCt);

    // For K stiffness matrix and R damping matrix:

    double mkfactor = Kfactor + Rfactor * this->GetMaterial()->Get_RayleighDampingK();
    H = mkfactor * CKCt;

    // For M mass matrix:
    if (Mfactor) {
        double lumped_node_mass = (this->Volume * this->Material->Get_density()) / 20.0;
        for (int id = 0; id < GetNdofs(); id++) {
            double amfactor = Mfactor + Rfactor * this->GetMaterial()->Get_RayleighDampingM();
            H(id, id) += amfactor * lumped_node_mass;
        }
    }
    //***TO DO*** better per-node lumping, or 12x12 consistent mass matrix.
}